

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_pvrtc1_4.h
# Opt level: O1

uint64_t __thiscall
basisu::pvrtc4_image::map_pixel
          (pvrtc4_image *this,uint32_t x,uint32_t y,color_rgba *c,bool perceptual,
          bool alpha_is_significant,bool record)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint32_t s;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  undefined7 in_register_00000081;
  long lVar10;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_48;
  byte local_44 [12];
  uint32_t local_38;
  uint32_t local_34;
  
  local_38 = x;
  local_34 = y;
  get_interpolated_colors(this,x,y,(color_rgba *)&local_48.field_1);
  bVar1 = (c->field_0).m_comps[0];
  auVar11 = extraout_XMM0;
  if ((int)CONCAT71(in_register_00000081,perceptual) == 0) {
    if (alpha_is_significant) {
      auVar11 = pmovzxbd(extraout_XMM0,local_48);
      auVar13._0_4_ = (uint)bVar1 - auVar11._0_4_;
      auVar13._4_4_ = (uint)(c->field_0).m_comps[1] - auVar11._4_4_;
      auVar13._8_4_ = (uint)(c->field_0).m_comps[2] - auVar11._8_4_;
      auVar13._12_4_ = (uint)(c->field_0).m_comps[3] - auVar11._12_4_;
      auVar13 = pmulld(auVar13,auVar13);
      auVar13 = phaddd(auVar13,auVar13);
      auVar13 = phaddd(auVar13,auVar13);
      uVar4 = auVar13._0_4_;
    }
    else {
      iVar2 = (uint)bVar1 - ((uint)local_48 & 0xff);
      iVar9 = (uint)(c->field_0).m_comps[1] - (uint)local_48.m_comps[1];
      iVar8 = (uint)(c->field_0).m_comps[2] - (uint)local_48.m_comps[2];
      uVar4 = iVar8 * iVar8 + iVar9 * iVar9 + iVar2 * iVar2;
    }
  }
  else {
    iVar2 = (uint)bVar1 - ((uint)local_48 & 0xff);
    iVar8 = (uint)(c->field_0).m_comps[2] - (uint)local_48.m_comps[2];
    iVar9 = iVar8 * 9 + iVar2 * 0x1b +
            ((uint)(c->field_0).m_comps[1] - (uint)local_48.m_comps[1]) * 0x5c;
    lVar3 = (long)(iVar2 * 0x80 - iVar9);
    lVar5 = (long)(iVar8 * 0x80 - iVar9);
    uVar4 = ((uint)((int)((ulong)(lVar5 * lVar5) >> 7) * 3) >> 7) +
            (int)((ulong)((long)iVar9 * (long)iVar9) >> 7) +
            ((uint)((int)((ulong)(lVar3 * lVar3) >> 7) * 0x1a) >> 7);
    if (alpha_is_significant) {
      iVar2 = ((uint)(c->field_0).m_comps[3] - ((uint)local_48 >> 0x18)) * 0x80;
      uVar4 = uVar4 + ((uint)(iVar2 * iVar2) >> 7);
    }
  }
  auVar11 = pmovzxbd(auVar11,c->field_0);
  s = 0;
  lVar3 = 1;
  uVar6 = (ulong)uVar4;
  do {
    bVar1 = local_44[lVar3 * 4 + -4];
    if (perceptual) {
      iVar9 = (uint)(c->field_0).m_comps[0] - (uint)bVar1;
      iVar2 = (uint)(c->field_0).m_comps[2] - (uint)local_44[lVar3 * 4 + -2];
      iVar8 = iVar2 * 9 + iVar9 * 0x1b +
              ((uint)(c->field_0).m_comps[1] - (uint)local_44[lVar3 * 4 + -3]) * 0x5c;
      lVar10 = (long)(iVar9 * 0x80 - iVar8);
      lVar5 = (long)(iVar2 * 0x80 - iVar8);
      uVar4 = ((uint)((int)((ulong)(lVar5 * lVar5) >> 7) * 3) >> 7) +
              (int)((ulong)((long)iVar8 * (long)iVar8) >> 7) +
              ((uint)((int)((ulong)(lVar10 * lVar10) >> 7) * 0x1a) >> 7);
      if (alpha_is_significant) {
        iVar2 = ((uint)(c->field_0).m_comps[3] - (uint)local_44[lVar3 * 4 + -1]) * 0x80;
        uVar4 = uVar4 + ((uint)(iVar2 * iVar2) >> 7);
      }
    }
    else if (alpha_is_significant) {
      auVar12._0_4_ = auVar11._0_4_ - (uint)bVar1;
      auVar12._4_4_ = auVar11._4_4_ - (uint)local_44[lVar3 * 4 + -3];
      auVar12._8_4_ = auVar11._8_4_ - (uint)local_44[lVar3 * 4 + -2];
      auVar12._12_4_ = auVar11._12_4_ - (uint)local_44[lVar3 * 4 + -1];
      auVar13 = pmulld(auVar12,auVar12);
      auVar13 = phaddd(auVar13,auVar13);
      auVar13 = phaddd(auVar13,auVar13);
      uVar4 = auVar13._0_4_;
    }
    else {
      iVar2 = (uint)(c->field_0).m_comps[0] - (uint)bVar1;
      iVar8 = (uint)(c->field_0).m_comps[1] - (uint)local_44[lVar3 * 4 + -3];
      iVar9 = (uint)(c->field_0).m_comps[2] - (uint)local_44[lVar3 * 4 + -2];
      uVar4 = iVar9 * iVar9 + iVar8 * iVar8 + iVar2 * iVar2;
    }
    uVar7 = (ulong)uVar4;
    if (uVar6 >= uVar7 && uVar6 != uVar7) {
      s = (uint32_t)lVar3;
    }
    if (uVar6 < uVar7) {
      uVar7 = uVar6;
    }
    lVar3 = lVar3 + 1;
    uVar6 = uVar7;
  } while (lVar3 != 4);
  if (record) {
    set_modulation(this,local_38,local_34,s);
  }
  return uVar7;
}

Assistant:

inline uint64_t map_pixel(uint32_t x, uint32_t y, const color_rgba& c, bool perceptual, bool alpha_is_significant, bool record = true)
		{
			color_rgba v[4];
			get_interpolated_colors(x, y, v);

			uint64_t best_dist = color_distance(perceptual, c, v[0], alpha_is_significant);
			uint32_t best_v = 0;
			for (uint32_t i = 1; i < 4; i++)
			{
				uint64_t dist = color_distance(perceptual, c, v[i], alpha_is_significant);
				if (dist < best_dist)
				{
					best_dist = dist;
					best_v = i;
				}
			}

			if (record)
				set_modulation(x, y, best_v);

			return best_dist;
		}